

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

reverse_iterator<unsigned_int_*>
math::wide_integer::detail::
import_export_helper<unsigned_char_const*,math::wide_integer::detail::iterator_detail::reverse_iterator<unsigned_int*>>
          (uchar *in,reverse_iterator<unsigned_int_*> out,signed_fast_type total_bits_to_use,
          unsigned_fast_type chunk_size_in,unsigned_fast_type chunk_size_out)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  
  if (0 < total_bits_to_use) {
    out.current[-1] = 0;
    uVar6 = total_bits_to_use - 1;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = chunk_size_in;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar6;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = chunk_size_out;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar6;
      if ((*in & (byte)(1 << (SUB161(auVar4 % auVar2,0) & 0x1f))) != 0) {
        out.current[-1] = out.current[-1] | 1 << (SUB161(auVar5 % auVar3,0) & 0x1f);
      }
      if (uVar6 != 0 && SUB164(auVar5 % auVar3,0) == 0) {
        out.current[-2] = 0;
        out.current = out.current + -1;
      }
      in = in + (SUB168(auVar4 % auVar2,0) == 0 && uVar6 != 0);
      lVar1 = uVar6 + 1;
      uVar6 = uVar6 - 1;
    } while (1 < lVar1);
  }
  return (reverse_iterator<unsigned_int_*>)out.current;
}

Assistant:

constexpr
  auto import_export_helper(      ForwardIterator    in,
                                  OutputIterator     out,
                            const   signed_fast_type total_bits_to_use, // NOLINT(bugprone-easily-swappable-parameters)
                            const unsigned_fast_type chunk_size_in,
                            const unsigned_fast_type chunk_size_out) -> OutputIterator
  {
    const auto size_to_loop_through =
      (detail::max_unsafe)
      (
        static_cast<signed_fast_type>(total_bits_to_use - static_cast<signed_fast_type>(INT8_C(1))),
        static_cast<signed_fast_type>(INT8_C(-1))
      );

    if(size_to_loop_through > static_cast<signed_fast_type>(INT8_C(-1)))
    {
      using local_output_value_type = typename detail::iterator_detail::iterator_traits<OutputIterator>::value_type;

      *out = static_cast<local_output_value_type>(UINT8_C(0));

      for(auto   i  = size_to_loop_through;
                 i >= static_cast<signed_fast_type>(INT8_C(0)); // NOLINT(altera-id-dependent-backward-branch)
               --i)
      {
        const auto input_bpos =
          static_cast<unsigned_fast_type>
          (
            static_cast<unsigned_fast_type>(i) % chunk_size_in
          );

        using local_input_value_type  = typename detail::iterator_detail::iterator_traits<ForwardIterator>::value_type;

        const auto input_bval_is_set =
        (
          static_cast<local_input_value_type>
          (
              *in
            & static_cast<local_input_value_type>(static_cast<local_input_value_type>(UINT8_C(1)) << input_bpos)
          )
          != static_cast<local_input_value_type>(UINT8_C(0))
        );

        const auto result_bpos =
          static_cast<local_output_value_type>
          (
            static_cast<unsigned_fast_type>(i) % chunk_size_out
          );

        if(input_bval_is_set)
        {
          *out =
            static_cast<local_output_value_type>
            (
                *out
              | static_cast<local_output_value_type>
                (
                  static_cast<local_output_value_type>(UINT8_C(1)) << result_bpos
                )
            );
        }

        const auto go_to_next_result_elem = (result_bpos == static_cast<local_output_value_type>(UINT8_C(0)));

        if(go_to_next_result_elem && (i != static_cast<signed_fast_type>(INT8_C(0))))
        {
          *(++out) = static_cast<local_output_value_type>(UINT8_C(0));
        }

        const auto go_to_next_input_elem = (input_bpos == static_cast<unsigned_fast_type>(UINT8_C(0)));

        if(go_to_next_input_elem && (i != static_cast<signed_fast_type>(INT8_C(0))))
        {
          ++in;
        }
      }
    }

    return out;
  }